

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

WrapMode glu::mapGLWrapMode(deUint32 wrapMode)

{
  InternalError *this;
  deUint64 local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  uint local_10;
  WrapMode local_c;
  deUint32 wrapMode_local;
  
  if (wrapMode == 0x2901) {
    local_c = REPEAT_GL;
  }
  else if (wrapMode == 0x812d) {
    local_c = CLAMP_TO_BORDER;
  }
  else if (wrapMode == 0x812f) {
    local_c = CLAMP_TO_EDGE;
  }
  else {
    if (wrapMode != 0x8370) {
      local_10 = wrapMode;
      this = (InternalError *)__cxa_allocate_exception(0x38);
      local_58 = (deUint64)tcu::toHex<unsigned_int>(local_10);
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_50,&local_58);
      std::operator+(&local_30,"Can\'t map GL wrap mode ",&local_50);
      tcu::InternalError::InternalError(this,&local_30);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    local_c = MIRRORED_REPEAT_GL;
  }
  return local_c;
}

Assistant:

static inline tcu::Sampler::WrapMode mapGLWrapMode (deUint32 wrapMode)
{
	switch (wrapMode)
	{
		case GL_CLAMP_TO_EDGE:		return tcu::Sampler::CLAMP_TO_EDGE;
		case GL_CLAMP_TO_BORDER:	return tcu::Sampler::CLAMP_TO_BORDER;
		case GL_REPEAT:				return tcu::Sampler::REPEAT_GL;
		case GL_MIRRORED_REPEAT:	return tcu::Sampler::MIRRORED_REPEAT_GL;
		default:
			throw tcu::InternalError("Can't map GL wrap mode " + tcu::toHex(wrapMode).toString());
	}
}